

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

void __thiscall GF2::WW<12UL>::Set(WW<12UL> *this,size_t pos1,size_t pos2,bool val)

{
  bool val_00;
  ulong uVar1;
  byte in_CL;
  sbyte sVar2;
  ulong in_RDX;
  word wVar3;
  ulong in_RSI;
  WW<12UL> *in_RDI;
  size_t pos;
  size_t wpos2;
  size_t wpos1;
  ulong local_38;
  ulong local_28;
  
  val_00 = (bool)(in_CL & 1);
  local_28 = in_RSI >> 6;
  uVar1 = in_RDX >> 6;
  local_38 = in_RSI;
  if (local_28 == uVar1) {
    while (local_38 < in_RDX) {
      Set(in_RDI,local_38,val_00);
      local_38 = local_38 + 1;
    }
  }
  else {
    if ((in_RSI & 0x3f) != 0) {
      sVar2 = (sbyte)(in_RSI & 0x3f);
      in_RDI[local_28]._words[0] = in_RDI[local_28]._words[0] << (0x40U - sVar2 & 0x3f);
      in_RDI[local_28]._words[0] = in_RDI[local_28]._words[0] >> (0x40U - sVar2 & 0x3f);
      if (val_00 != false) {
        in_RDI[local_28]._words[0] = -1L << sVar2 | in_RDI[local_28]._words[0];
      }
      local_28 = local_28 + 1;
    }
    if ((in_RDX & 0x3f) != 0) {
      sVar2 = (sbyte)(in_RDX & 0x3f);
      in_RDI[uVar1]._words[0] = in_RDI[uVar1]._words[0] >> sVar2;
      in_RDI[uVar1]._words[0] = in_RDI[uVar1]._words[0] << sVar2;
      if (val_00 != false) {
        in_RDI[uVar1]._words[0] =
             0xffffffffffffffffU >> (0x40U - sVar2 & 0x3f) | in_RDI[uVar1]._words[0];
      }
    }
    local_38 = local_28;
    while (local_38 < uVar1) {
      wVar3 = 0;
      if (val_00 != false) {
        wVar3 = 0xffffffffffffffff;
      }
      in_RDI[local_38]._words[0] = wVar3;
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void Set(size_t pos1, size_t pos2, bool val)
	{	
		// номера слов представлений
		size_t wpos1 = pos1 / B_PER_W, wpos2 = pos2 / B_PER_W, pos;
		// в одном слове?
		if (wpos1 == wpos2)
		{
			for (pos = pos1; pos < pos2; Set(pos++, val));
			return;
		}
		// начинаем посередине слова представления?
		if (pos = pos1 % B_PER_W)
		{
			(_words[wpos1] <<= (B_PER_W - pos)) >>= B_PER_W - pos;
			if (val) 
				_words[wpos1] |= WORD_MAX << pos;
			wpos1++;
		}
		// заканчиваем посередине слова представления?
		if (pos = pos2 % B_PER_W)
		{
			(_words[wpos2] >>= pos) <<= pos;
			if (val) 
				_words[wpos2] |= WORD_MAX >> (B_PER_W - pos);
		}
		// заполняем полные слова
		for (pos = wpos1; pos < wpos2; _words[pos++] = (val ? WORD_MAX : 0));
	}